

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImFontAtlasCustomRect>::push_back
          (ImVector<ImFontAtlasCustomRect> *this,ImFontAtlasCustomRect *v)

{
  ImVec2 *pIVar1;
  ImFontAtlasCustomRect *pIVar2;
  ImFont *pIVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  uint uVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int new_capacity;
  
  iVar11 = this->Size;
  if (iVar11 == this->Capacity) {
    if (iVar11 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar11 / 2 + iVar11;
    }
    new_capacity = iVar11 + 1;
    if (iVar11 + 1 < iVar10) {
      new_capacity = iVar10;
    }
    reserve(this,new_capacity);
    iVar11 = this->Size;
  }
  pIVar2 = this->Data;
  uVar4 = v->Width;
  uVar5 = v->Height;
  uVar6 = v->X;
  uVar7 = v->Y;
  uVar8 = v->GlyphID;
  fVar9 = v->GlyphAdvanceX;
  pIVar3 = v->Font;
  pIVar1 = &pIVar2[iVar11].GlyphOffset;
  *pIVar1 = v->GlyphOffset;
  pIVar1[1] = (ImVec2)pIVar3;
  pIVar2 = pIVar2 + iVar11;
  pIVar2->Width = uVar4;
  pIVar2->Height = uVar5;
  pIVar2->X = uVar6;
  pIVar2->Y = uVar7;
  pIVar2->GlyphID = uVar8;
  pIVar2->GlyphAdvanceX = fVar9;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }